

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolortransform.cpp
# Opt level: O0

void storeUnpremultipliedLUT<QRgba64>
               (QCmyk32 *dst,QRgba64 *param_2,QColorVector *buffer,qsizetype len)

{
  long in_RCX;
  long in_RDX;
  long in_RDI;
  long in_FS_OFFSET;
  int k;
  int y;
  int m;
  int c;
  qsizetype i;
  long local_38;
  QCmyk32 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  for (local_38 = 0; local_38 < in_RCX; local_38 = local_38 + 1) {
    QCmyk32::QCmyk32(&local_c,(int)(*(float *)(in_RDX + local_38 * 0x10) * 255.0),
                     (int)(*(float *)(in_RDX + local_38 * 0x10 + 4) * 255.0),
                     (int)(*(float *)(in_RDX + local_38 * 0x10 + 8) * 255.0),
                     (int)(*(float *)(in_RDX + local_38 * 0x10 + 0xc) * 255.0));
    *(uint *)(in_RDI + local_38 * 4) = local_c.m_cmyk;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void storeUnpremultipliedLUT(QCmyk32 *dst, const T *, const QColorVector *buffer, const qsizetype len)
{
    for (qsizetype i = 0; i < len; ++i) {
        const int c = buffer[i].x * 255.f;
        const int m = buffer[i].y * 255.f;
        const int y = buffer[i].z * 255.f;
        const int k = buffer[i].w * 255.f;
        dst[i] = QCmyk32(c, m, y, k);
    }
}